

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

float4x4 *
ConvexDecomposition::MatrixLookAt
          (float4x4 *__return_storage_ptr__,float3 *eye,float3 *at,float3 *up)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar3;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar11 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  undefined1 auVar15 [60];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  float3 fVar16;
  float3 local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float4x4 local_60;
  
  local_60.x.w = 0.0;
  local_60.y.x = 0.0;
  local_60.y.y = 0.0;
  local_60.y.z = 0.0;
  local_60.y.w = 0.0;
  local_60.z.x = 0.0;
  local_60.z.y = 0.0;
  local_60.z.z = 0.0;
  local_60.z.w = 0.0;
  local_60.w.w = 1.0;
  local_60.w.x = eye->x;
  local_60.w.y = eye->y;
  local_60.w.z = eye->z;
  uVar1 = eye->x;
  uVar4 = eye->y;
  auVar7._4_4_ = uVar4;
  auVar7._0_4_ = uVar1;
  auVar7._8_8_ = 0;
  uVar2 = at->x;
  uVar5 = at->y;
  auVar12._4_4_ = uVar5;
  auVar12._0_4_ = uVar2;
  auVar12._8_8_ = 0;
  auVar7 = vsubps_avx(auVar7,auVar12);
  local_98.z = eye->z - at->z;
  local_98._0_8_ = vmovlps_avx(auVar7);
  auVar11 = ZEXT856(auVar7._8_8_);
  auVar15 = (undefined1  [60])0x0;
  fVar16 = normalize(&local_98);
  auVar13._0_4_ = fVar16.z;
  auVar13._4_60_ = auVar15;
  auVar9._0_8_ = fVar16._0_8_;
  auVar9._8_56_ = auVar11;
  local_78 = auVar9._0_16_;
  uVar3 = vmovlps_avx(local_78);
  local_60.z.x = (float)uVar3;
  local_60.z.y = (float)((ulong)uVar3 >> 0x20);
  local_88 = vmovshdup_avx(local_78);
  auVar7 = vfmsub231ss_fma(ZEXT416((uint)(local_88._0_4_ * up->z)),ZEXT416((uint)up->y),
                           auVar13._0_16_);
  auVar12 = vfmsub231ss_fma(ZEXT416((uint)(auVar13._0_4_ * up->x)),local_78,ZEXT416((uint)up->z));
  auVar8 = vfmsub231ss_fma(ZEXT416((uint)(fVar16.x * up->y)),local_88,ZEXT416((uint)up->x));
  auVar15 = ZEXT1260(auVar8._4_12_);
  auVar7 = vinsertps_avx(auVar7,auVar12,0x10);
  local_98._0_8_ = vmovlps_avx(auVar7);
  local_98.z = auVar8._0_4_;
  local_60.z.z = auVar13._0_4_;
  fVar16 = normalize(&local_98);
  auVar14._0_4_ = fVar16.z;
  auVar14._4_60_ = auVar15;
  auVar10._0_8_ = fVar16._0_8_;
  auVar10._8_56_ = auVar11;
  auVar8 = auVar10._0_16_;
  auVar7 = vmovshdup_avx(auVar8);
  local_60.x._0_8_ = vmovlps_avx(auVar8);
  auVar12 = vfmsub231ss_fma(ZEXT416((uint)(auVar7._0_4_ * auVar13._0_4_)),local_88,auVar14._0_16_);
  auVar8 = vfmsub231ss_fma(ZEXT416((uint)(auVar14._0_4_ * local_78._0_4_)),auVar8,
                           ZEXT416((uint)auVar13._0_4_));
  auVar6 = vfmsub231ss_fma(ZEXT416((uint)(fVar16.x * local_88._0_4_)),local_78,auVar7);
  auVar7 = vinsertps_avx(auVar12,auVar8,0x10);
  uVar3 = vmovlps_avx(auVar7);
  local_60.y.x = (float)uVar3;
  local_60.y.y = (float)((ulong)uVar3 >> 0x20);
  local_60.y.z = auVar6._0_4_;
  local_60.x.z = auVar14._0_4_;
  MatrixRigidInverse(__return_storage_ptr__,&local_60);
  return __return_storage_ptr__;
}

Assistant:

float4x4 MatrixLookAt(const float3& eye, const float3& at, const float3& up)
{
	float4x4 m;
	m.w.w = 1.0f;
	m.w.xyz() = eye;
	m.z.xyz() = normalize(eye-at);
	m.x.xyz() = normalize(cross(up,m.z.xyz()));
	m.y.xyz() = cross(m.z.xyz(),m.x.xyz());
	return MatrixRigidInverse(m);
}